

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

QByteArray * __thiscall QByteArray::replace(QByteArray *this,char before,char after)

{
  char *pcVar1;
  size_t __n;
  Data *pDVar2;
  char *pcVar3;
  long lVar4;
  QArrayData *data;
  qsizetype qVar5;
  void *pvVar6;
  Initialization extraout_EDX;
  Initialization IVar7;
  undefined7 in_register_00000011;
  char cVar8;
  char *b;
  ptrdiff_t _Num;
  size_t __n_00;
  long lVar9;
  long in_FS_OFFSET;
  QByteArray local_58;
  long local_38;
  
  IVar7 = (Initialization)CONCAT71(in_register_00000011,after);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (before == after) goto LAB_00156f37;
  pcVar1 = (this->d).ptr;
  __n = (this->d).size;
  if (__n == 0) {
LAB_00156e20:
    __n_00 = 0xffffffffffffffff;
  }
  else {
    pvVar6 = memchr(pcVar1,(int)before,__n);
    IVar7 = extraout_EDX;
    if (pvVar6 == (void *)0x0) goto LAB_00156e20;
    __n_00 = (long)pvVar6 - (long)pcVar1;
  }
  if (-1 < (long)__n_00) {
    pDVar2 = (this->d).d;
    if ((pDVar2 == (Data *)0x0) ||
       (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      QByteArray(&local_58,__n,IVar7);
      pcVar1 = local_58.d.ptr;
      if (__n_00 != 0) {
        memmove(local_58.d.ptr,(this->d).ptr,__n_00);
      }
      pcVar1[__n_00] = after;
      pcVar3 = (this->d).ptr;
      lVar4 = (this->d).size;
      if (pcVar3 + __n_00 + 1 != pcVar3 + lVar4) {
        lVar9 = __n_00 + 1;
        do {
          cVar8 = pcVar3[lVar9];
          if (pcVar3[lVar9] == before) {
            cVar8 = after;
          }
          pcVar1[lVar9] = cVar8;
          lVar9 = lVar9 + 1;
        } while (lVar4 != lVar9);
      }
      data = &((this->d).d)->super_QArrayData;
      pcVar1 = (this->d).ptr;
      (this->d).d = local_58.d.d;
      (this->d).ptr = local_58.d.ptr;
      qVar5 = (this->d).size;
      (this->d).size = local_58.d.size;
      local_58.d.d = (Data *)data;
      local_58.d.ptr = pcVar1;
      local_58.d.size = qVar5;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,1,0x10);
        }
      }
    }
    else {
      pcVar1[__n_00] = after;
      pcVar1 = (this->d).ptr;
      lVar4 = (this->d).size;
      if (pcVar1 + __n_00 + 1 != pcVar1 + lVar4) {
        lVar9 = __n_00 + 1;
        do {
          if (pcVar1[lVar9] == before) {
            pcVar1[lVar9] = after;
          }
          lVar9 = lVar9 + 1;
        } while (lVar4 != lVar9);
      }
    }
  }
LAB_00156f37:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray &QByteArray::replace(char before, char after)
{
    if (before != after) {
        if (const auto pos = indexOf(before); pos >= 0) {
            if (d.needsDetach()) {
                QByteArray tmp(size(), Qt::Uninitialized);
                auto dst = tmp.d.data();
                dst = std::copy(d.data(), d.data() + pos, dst);
                *dst++ = after;
                std::replace_copy(d.data() + pos + 1, d.end(), dst, before, after);
                swap(tmp);
            } else {
                // in-place
                d.data()[pos] = after;
                std::replace(d.data() + pos + 1, d.end(), before, after);
            }
        }
    }
    return *this;
}